

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O0

void google::protobuf::compiler::WriteShort(CodedOutputStream *out,uint16_t val)

{
  uint16_t local_14;
  uint16_t local_12;
  uint8_t p [2];
  CodedOutputStream *pCStack_10;
  uint16_t val_local;
  CodedOutputStream *out_local;
  
  local_12 = val;
  pCStack_10 = out;
  local_14 = val;
  io::CodedOutputStream::WriteRaw(out,&local_14,2);
  return;
}

Assistant:

static void WriteShort(io::CodedOutputStream* out, uint16_t val) {
  uint8_t p[2];
  p[0] = static_cast<uint8_t>(val);
  p[1] = static_cast<uint8_t>(val >> 8);
  out->WriteRaw(p, 2);
}